

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_encoder.c
# Opt level: O2

void stream_encoder_end(void *coder_ptr,lzma_allocator *allocator)

{
  undefined8 *puVar1;
  
  lzma_next_end((lzma_next_coder *)((long)coder_ptr + 8),allocator);
  lzma_next_end((lzma_next_coder *)((long)coder_ptr + 0x170),allocator);
  lzma_index_end(*(lzma_index **)((long)coder_ptr + 0x1b8),allocator);
  for (puVar1 = (undefined8 *)((long)coder_ptr + 0x128); puVar1[-1] != -1; puVar1 = puVar1 + 2) {
    lzma_free((void *)*puVar1,allocator);
  }
  lzma_free(coder_ptr,allocator);
  return;
}

Assistant:

static void
stream_encoder_end(void *coder_ptr, const lzma_allocator *allocator)
{
	lzma_stream_coder *coder = coder_ptr;

	lzma_next_end(&coder->block_encoder, allocator);
	lzma_next_end(&coder->index_encoder, allocator);
	lzma_index_end(coder->index, allocator);

	for (size_t i = 0; coder->filters[i].id != LZMA_VLI_UNKNOWN; ++i)
		lzma_free(coder->filters[i].options, allocator);

	lzma_free(coder, allocator);
	return;
}